

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)

{
  uint8_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference __a;
  reference __b;
  code *in_RDI;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  undefined8 in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined1 isAnyValue;
  uint32_t in_stack_ffffffffffffff28;
  undefined4 uVar5;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff3c;
  uint8_t uVar6;
  uint8_t in_stack_ffffffffffffff4e;
  undefined1 *puVar7;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  Image *in_stack_ffffffffffffff80;
  undefined1 local_58 [40];
  ImageTemplate<unsigned_char> local_30;
  code *local_8;
  
  uVar6 = (uint8_t)((uint)in_stack_ffffffffffffff3c >> 0x18);
  local_8 = in_RDI;
  uVar1 = Unit_Test::intensityValue();
  puVar7 = local_58;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT13(in_stack_ffffffffffffff2f,
                      CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
             in_stack_ffffffffffffff28,(uint8_t)((ulong)in_stack_ffffffffffffff20 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff20 >> 0x30));
  Test_Helper::uniformRGBImage
            (uVar6,(Image *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e080f);
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  uVar6 = (uint8_t)((ulong)in_stack_ffffffffffffff18 >> 0x38);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::alignment(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffff58,(uint32_t)((ulong)puVar7 >> 0x20),(uint32_t)puVar7,uVar1,
             in_stack_ffffffffffffff4e);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width
                    ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffff58);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height
                    ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffff58);
  uVar1 = Unit_Test::intensityValue();
  Unit_Test::fillImage
            ((Image *)CONCAT44(uVar3,uVar4),
             CONCAT13(uVar1,CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
             in_stack_ffffffffffffff28,(uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff20,uVar6);
  (*local_8)(&local_30,&stack0xffffffffffffff58);
  uVar5 = 0;
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff80;
  __a = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,2);
  isAnyValue = (undefined1)((ulong)this >> 0x38);
  std::swap<unsigned_char>(__a,__b);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT44(uVar3,uVar4),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff2e,
                                             CONCAT24(in_stack_ffffffffffffff2c,uVar5))),
                     (bool)isAnyValue);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e099e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar3,uVar4));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e09b5);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form2_RgbToBgr(RgbToBgrForm2 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        PenguinV_Image::Image output = input.generate( input.width(), input.height(), input.colorCount(), input.alignment() );
        fillImage( output, 0, 0, output.width(), output.height(), intensityValue() );

        RgbToBgr( input, output );

        std::swap( intensity[0], intensity[2] );

        return verifyImage( output, intensity, false );
    }